

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::is_socket_alive(socket_t sock)

{
  int *piVar1;
  ssize_t sVar2;
  undefined1 local_19;
  ssize_t sStack_18;
  char buf [1];
  ssize_t val;
  socket_t sock_local;
  
  sStack_18 = select_read(sock,0,0);
  if (sStack_18 == 0) {
    val._7_1_ = true;
  }
  else {
    if ((sStack_18 < 0) && (piVar1 = __errno_location(), *piVar1 == 9)) {
      return false;
    }
    sVar2 = read_socket(sock,&local_19,1,2);
    val._7_1_ = 0 < sVar2;
  }
  return val._7_1_;
}

Assistant:

inline bool is_socket_alive(socket_t sock) {
  const auto val = detail::select_read(sock, 0, 0);
  if (val == 0) {
    return true;
  } else if (val < 0 && errno == EBADF) {
    return false;
  }
  char buf[1];
  return detail::read_socket(sock, &buf[0], sizeof(buf), MSG_PEEK) > 0;
}